

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> ** __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>::
PrependNode<Memory::ArenaAllocator,Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*>
          (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>
           *this,ArenaAllocator *allocator,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *param1)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *this_00;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  **ppDVar1;
  TrackAllocData local_58;
  DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *local_30;
  Node *newNode;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *param1_local;
  ArenaAllocator *allocator_local;
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
  *this_local;
  
  newNode = (Node *)param1;
  param1_local = (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                 allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x117);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&allocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_58);
  this_00 = (DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
             *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)alloc,0x3f67b0);
  DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>::
  DListNode(this_00,(ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)
                    &newNode);
  if (this_00 ==
      (DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*> *)
      0x0) {
    this_local = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
                  *)0x0;
  }
  else {
    local_30 = this_00;
    ppDVar1 = DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
              ::Next((DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
                      *)this);
    DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
    ::InsertNodeBefore(*ppDVar1,&local_30->
                                 super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
                      );
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
                  *)&local_30->data;
  }
  return (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }